

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chaiscript_parser.hpp
# Opt level: O0

bool __thiscall chaiscript::parser::ChaiScript_Parser::Map_Pair(ChaiScript_Parser *this)

{
  bool bVar1;
  string *t_fname;
  size_type sVar2;
  string *in_RDI;
  undefined6 in_stack_00000030;
  bool in_stack_00000036;
  bool in_stack_00000037;
  char *in_stack_00000038;
  ChaiScript_Parser *in_stack_00000040;
  Position prev_pos;
  size_type prev_stack_top;
  bool retval;
  size_t in_stack_000002d0;
  ChaiScript_Parser *in_stack_000002d8;
  __shared_ptr_access<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  *in_stack_ffffffffffffff30;
  size_type sVar3;
  File_Position *t_where;
  eval_error *in_stack_ffffffffffffff60;
  string local_98 [35];
  undefined1 local_75;
  File_Position local_74 [3];
  undefined8 local_59;
  undefined8 local_38;
  undefined8 local_30;
  size_type local_28;
  size_type local_20;
  size_type local_18;
  byte local_9;
  
  local_9 = 0;
  local_18 = std::
             vector<std::shared_ptr<chaiscript::AST_Node>,_std::allocator<std::shared_ptr<chaiscript::AST_Node>_>_>
             ::size((vector<std::shared_ptr<chaiscript::AST_Node>,_std::allocator<std::shared_ptr<chaiscript::AST_Node>_>_>
                     *)&in_RDI[3].field_2);
  local_38 = *(undefined8 *)((long)&in_RDI[0x65].field_2 + 8);
  local_30 = *(undefined8 *)(in_RDI + 0x66);
  local_28 = in_RDI[0x66]._M_string_length;
  local_20 = in_RDI[0x66].field_2._M_allocated_capacity;
  bVar1 = Operator(in_stack_000002d8,in_stack_000002d0);
  if (bVar1) {
    bVar1 = Symbol(in_stack_00000040,in_stack_00000038,in_stack_00000037,in_stack_00000036);
    if (bVar1) {
      local_9 = 1;
      bVar1 = Operator(in_stack_000002d8,in_stack_000002d0);
      if (!bVar1) {
        local_75 = 1;
        t_fname = (string *)__cxa_allocate_exception(0x90);
        t_where = (File_Position *)&local_59;
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  ((string *)((long)&local_59 + 1),"Incomplete map pair",(allocator *)t_where);
        File_Position::File_Position
                  (local_74,*(int *)((long)&in_RDI[0x65].field_2 + 8),
                   *(int *)((long)&in_RDI[0x65].field_2 + 0xc));
        std::
        __shared_ptr_access<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
        ::operator*(in_stack_ffffffffffffff30);
        exception::eval_error::eval_error(in_stack_ffffffffffffff60,in_RDI,t_where,t_fname);
        local_75 = 0;
        __cxa_throw(t_fname,&exception::eval_error::typeinfo,exception::eval_error::~eval_error);
      }
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_98,"",(allocator *)&stack0xffffffffffffff67);
      build_match<chaiscript::eval::Map_Pair_AST_Node>
                (in_stack_00000040,(size_t)in_stack_00000038,
                 (string *)CONCAT17(in_stack_00000037,CONCAT16(in_stack_00000036,in_stack_00000030))
                );
      std::__cxx11::string::~string(local_98);
      std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff67);
    }
    else {
      *(undefined8 *)((long)&in_RDI[0x65].field_2 + 8) = local_38;
      *(undefined8 *)(in_RDI + 0x66) = local_30;
      in_RDI[0x66]._M_string_length = local_28;
      *(undefined4 *)&in_RDI[0x66].field_2 = (undefined4)local_20;
      while (sVar3 = local_18,
            sVar2 = std::
                    vector<std::shared_ptr<chaiscript::AST_Node>,_std::allocator<std::shared_ptr<chaiscript::AST_Node>_>_>
                    ::size((vector<std::shared_ptr<chaiscript::AST_Node>,_std::allocator<std::shared_ptr<chaiscript::AST_Node>_>_>
                            *)&in_RDI[3].field_2), sVar3 != sVar2) {
        std::
        vector<std::shared_ptr<chaiscript::AST_Node>,_std::allocator<std::shared_ptr<chaiscript::AST_Node>_>_>
        ::pop_back((vector<std::shared_ptr<chaiscript::AST_Node>,_std::allocator<std::shared_ptr<chaiscript::AST_Node>_>_>
                    *)0x249195);
      }
    }
  }
  return (bool)(local_9 & 1);
}

Assistant:

bool Map_Pair() {
        bool retval = false;

        const auto prev_stack_top = m_match_stack.size();
        const auto prev_pos = m_position;

        if (Operator()) {
          if (Symbol(":")) {
            retval = true;
            if (!Operator()) {
              throw exception::eval_error("Incomplete map pair", File_Position(m_position.line, m_position.col), *m_filename);
            }

            build_match<eval::Map_Pair_AST_Node>(prev_stack_top);
          }
          else {
            m_position = prev_pos;
            while (prev_stack_top != m_match_stack.size()) {
              m_match_stack.pop_back();
            }
          }
        }

        return retval;
      }